

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

void __thiscall booster::log::sinks::syslog::~syslog(syslog *this,int __pri,char *__fmt,...)

{
  data *pdVar1;
  
  (this->super_sink)._vptr_sink = (_func_int **)&PTR_log_001cf4d8;
  pdVar1 = (this->d).ptr_;
  if ((pdVar1 != (data *)0x0) && (pdVar1->log_was_opened == true)) {
    closelog();
  }
  hold_ptr<booster::log::sinks::syslog::data>::~hold_ptr(&this->d);
  return;
}

Assistant:

syslog::~syslog()
		{
			if(d.get() && d->log_was_opened)
				closelog();
		}